

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Analyser::Static::PCCompatible::Target>::
declare<Analyser::Static::PCCompatible::Target::VideoAdaptor>
          (StructImpl<Analyser::Static::PCCompatible::Target> *this,VideoAdaptor *t,string *name)

{
  string *name_local;
  VideoAdaptor *t_local;
  StructImpl<Analyser::Static::PCCompatible::Target> *this_local;
  
  declare_emplace<Analyser::Static::PCCompatible::Target::VideoAdaptor>(this,t,name,1);
  return;
}

Assistant:

void declare(Type *t, const std::string &name) {
			// If the declared item is a class, see whether it can be dynamically cast
			// to a reflectable for emplacement. If so, exit early.
			if constexpr (std::is_class<Type>()) {
				if(declare_reflectable(t, name)) return;
			}

			// If the declared item is an array, record it as a pointer to the
			// first element plus a size.
			if constexpr (std::is_array<Type>()) {
				declare_emplace(&(*t)[0], name, sizeof(*t) / sizeof(*t[0]));
				return;
			}

			declare_emplace(t, name);
		}